

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileHTTP.cpp
# Opt level: O3

void __thiscall adios2::transport::FileHTTP::~FileHTTP(FileHTTP *this)

{
  pointer pcVar1;
  
  (this->super_Transport)._vptr_Transport = (_func_int **)&PTR__FileHTTP_008741a8;
  pcVar1 = (this->m_hostname)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_hostname).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->request_template)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->request_template).field_2) {
    operator_delete(pcVar1);
  }
  Transport::~Transport(&this->super_Transport);
  return;
}

Assistant:

FileHTTP::~FileHTTP()
{
    if (m_IsOpen)
    {
    }
}